

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  vector<int,_std::allocator<int>_> *__x;
  size_type *psVar1;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  Message *message;
  pointer piVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  DescriptorBuilder *file;
  SourceCodeInfo *this_01;
  FileDescriptorTables *pFVar7;
  DescriptorPool *pDVar8;
  Tables *pTVar9;
  void *pvVar10;
  pointer pOVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  pointer pcVar14;
  string *psVar15;
  FileDescriptor *pFVar16;
  _Base_ptr p_Var17;
  undefined4 extraout_var;
  FieldDescriptor *pFVar18;
  LogMessage *pLVar19;
  undefined4 extraout_var_00;
  MessageLite *this_02;
  long *plVar20;
  undefined8 *puVar21;
  pointer pcVar22;
  long lVar23;
  long *plVar24;
  ulong *puVar25;
  long lVar26;
  void *extraout_RDX;
  void *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  Reflection *this_03;
  Reflection *this_04;
  Reflection *this_05;
  Reflection *this_06;
  Reflection *this_07;
  FileDescriptor *extraout_RDX_02;
  FileDescriptor *extraout_RDX_03;
  FileDescriptor *extraout_RDX_04;
  pointer pOVar27;
  undefined1 *puVar28;
  ulong uVar29;
  undefined8 uVar30;
  pointer pOVar31;
  MessageLite *pMVar32;
  int i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar34;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar35;
  string buf;
  vector<int,_std::allocator<int>_> src_path;
  FileDescriptor *dependency;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  string local_2b8;
  string local_298;
  vector<int,_std::allocator<int>_> local_278;
  pointer local_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  SourceCodeInfo *local_238;
  MessageLite *local_230;
  string local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  DescriptorBuilder *local_1e8;
  LogMessage local_1e0;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [56];
  _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_160;
  DynamicMessageFactory local_130;
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  size_type local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  LogMessage local_68;
  undefined4 extraout_var_01;
  
  file = (DescriptorBuilder *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
  this->file_ = (FileDescriptor *)file;
  *(undefined2 *)&(file->filename_)._M_string_length = 0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    local_238 = (SourceCodeInfo *)0x0;
    this_01 = SourceCodeInfo::default_instance();
  }
  else {
    this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    puVar28 = (undefined1 *)proto->source_code_info_;
    if ((SourceCodeInfo *)puVar28 == (SourceCodeInfo *)0x0) {
      puVar28 = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_01,(SourceCodeInfo *)puVar28);
    local_238 = this_01;
  }
  *(SourceCodeInfo **)&(file->unused_dependency_)._M_t._M_impl = this_01;
  pFVar7 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar7;
  *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar7;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    local_1a8._8_8_ = (OptionsToInterpret *)0x0;
    auStack_198._0_8_ = auStack_198._0_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = (DescriptorBuilder *)auStack_198;
    AddError(this,(string *)local_1a8,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    if ((DescriptorBuilder *)local_1a8._0_8_ != (DescriptorBuilder *)auStack_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  psVar15 = (proto->syntax_).ptr_;
  if ((psVar15->_M_string_length == 0) ||
     (iVar5 = std::__cxx11::string::compare((char *)psVar15), iVar5 == 0)) {
    *(undefined4 *)(this->file_ + 0x3c) = 2;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)(proto->syntax_).ptr_);
    if (iVar5 == 0) {
      *(undefined4 *)(this->file_ + 0x3c) = 3;
    }
    else {
      *(undefined4 *)(this->file_ + 0x3c) = 0;
      psVar15 = (proto->name_).ptr_;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Unrecognized syntax: ",(proto->syntax_).ptr_);
      AddError(this,psVar15,&proto->super_Message,OTHER,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((DescriptorBuilder *)local_1a8._0_8_ != (DescriptorBuilder *)auStack_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
    }
  }
  pDVar8 = (DescriptorPool *)
           DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  file->pool_ = pDVar8;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    local_1a8._8_8_ = (OptionsToInterpret *)0x0;
    auStack_198._0_8_ = auStack_198._0_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = (DescriptorBuilder *)auStack_198;
    pTVar9 = (Tables *)DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_1a8);
    file->tables_ = pTVar9;
    if ((DescriptorBuilder *)local_1a8._0_8_ != (DescriptorBuilder *)auStack_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  else {
    pTVar9 = (Tables *)DescriptorPool::Tables::AllocateString(this->tables_,(proto->package_).ptr_);
    file->tables_ = pTVar9;
  }
  file->error_collector_ = (ErrorCollector *)this->pool_;
  bVar4 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)file);
  if (bVar4) {
    if ((file->tables_->pending_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      AddPackage(this,(string *)file->tables_,&proto->super_Message,(FileDescriptor *)file);
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar5 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&(file->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_finish = iVar5;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar5 << 3);
    (file->filename_).field_2._M_allocated_capacity = (size_type)pvVar10;
    if (this->pool_->lazily_build_dependencies_ == true) {
      pOVar11 = (pointer)DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      (file->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = pOVar11;
      pvVar10 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,
                           (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ << 3);
      *(void **)((long)&(file->filename_).field_2 + 8) = pvVar10;
      lVar26 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      if (0 < lVar26) {
        memset(pvVar10,0,lVar26 << 3);
      }
    }
    else {
      (file->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      *(undefined8 *)((long)&(file->filename_).field_2 + 8) = 0;
    }
    this_00 = &this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this_00->_M_t);
    pcVar3 = local_c8 + 8;
    local_c8._8_4_ = _S_red;
    local_c8._16_8_ = (undefined1 *)0x0;
    local_a0 = 0;
    local_c8._24_8_ = pcVar3;
    local_a8._M_p = pcVar3;
    if (0 < (proto->weak_dependency_).current_size_) {
      lVar26 = 0;
      do {
        local_1a8._0_4_ =
             *(undefined4 *)((long)(proto->weak_dependency_).arena_or_elements_ + lVar26 * 4);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_c8,(int *)local_1a8);
        lVar26 = lVar26 + 1;
      } while (lVar26 < (proto->weak_dependency_).current_size_);
    }
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      lVar26 = 0;
      do {
        pVar34 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_98,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26]
                           );
        if (((undefined1  [16])pVar34 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          AddTwiceListedError(this,proto,(int)lVar26);
        }
        local_1a8._0_8_ = *((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[lVar26];
        cVar12 = std::
                 _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)local_1a8);
        if (cVar12.
            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_1e0._0_8_ = (DescriptorBuilder *)0x0;
        }
        else {
          local_1e0._0_8_ =
               *(undefined8 *)
                ((long)cVar12.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10);
        }
        if (((DescriptorBuilder *)local_1e0._0_8_ == (DescriptorBuilder *)0x0) &&
           (pDVar8 = this->pool_->underlay_, pDVar8 != (DescriptorPool *)0x0)) {
          local_1e0._0_8_ =
               DescriptorPool::FindFileByName
                         (pDVar8,(string *)
                                 ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                                 [lVar26]);
        }
        if ((DescriptorBuilder *)local_1e0._0_8_ == file) {
          file = (DescriptorBuilder *)0x0;
          goto LAB_002daaf7;
        }
        pDVar8 = this->pool_;
        if ((DescriptorBuilder *)local_1e0._0_8_ == (DescriptorBuilder *)0x0) {
          if (pDVar8->lazily_build_dependencies_ == false) {
            if (pDVar8->allow_unknown_ == false) {
              pcVar14 = pcVar3;
              pcVar22 = (pointer)local_c8._16_8_;
              if (pDVar8->enforce_weak_ == false) {
                for (; pcVar22 != (pointer)0x0;
                    pcVar22 = *(pointer *)
                               (pcVar22 + (ulong)(*(int *)(pcVar22 + 0x20) < lVar26) * 8 + 0x10)) {
                  if (lVar26 <= *(int *)(pcVar22 + 0x20)) {
                    pcVar14 = pcVar22;
                  }
                }
                pcVar22 = pcVar3;
                if ((pcVar14 != pcVar3) && (pcVar22 = pcVar14, lVar26 < *(int *)(pcVar14 + 0x20))) {
                  pcVar22 = pcVar3;
                }
                if (pcVar22 != pcVar3) goto LAB_002d9edc;
              }
              AddImportError(this,proto,(int)lVar26);
            }
            else {
LAB_002d9edc:
              local_1e0._0_8_ =
                   DescriptorPool::NewPlaceholderFileWithMutexHeld
                             (pDVar8,(string *)
                                     ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[lVar26]);
            }
          }
        }
        else if (((pDVar8->enforce_dependencies_ == true) &&
                 (cVar13 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find(&(pDVar8->unused_import_track_files_)._M_t,(proto->name_).ptr_),
                 (_Rb_tree_header *)cVar13._M_node !=
                 &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header)) &&
                (*(int *)((long)&(((vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                    *)(local_1e0._0_8_ + 0x18))->
                                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + 4) == 0)) {
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this_00,(FileDescriptor **)&local_1e0);
        }
        *(undefined8 *)((file->filename_).field_2._M_allocated_capacity + lVar26 * 8) =
             local_1e0._0_8_;
        if ((this->pool_->lazily_build_dependencies_ == true) &&
           ((DescriptorBuilder *)local_1e0._0_8_ == (DescriptorBuilder *)0x0)) {
          psVar15 = DescriptorPool::Tables::AllocateString
                              (this->tables_,
                               (string *)
                               ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                               [lVar26]);
          *(string **)(*(long *)((long)&(file->filename_).field_2 + 8) + lVar26 * 8) = psVar15;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pFVar16 = (FileDescriptor *)
              DescriptorPool::Tables::AllocateBytes
                        (this->tables_,(proto->public_dependency_).current_size_ << 2);
    file->file_ = pFVar16;
    if ((proto->public_dependency_).current_size_ < 1) {
      iVar5 = 0;
    }
    else {
      lVar26 = 0;
      iVar5 = 0;
      do {
        iVar6 = *(int *)((long)(proto->public_dependency_).arena_or_elements_ + lVar26 * 4);
        if (((long)iVar6 < 0) ||
           ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar6)) {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar23 = (long)iVar5;
          iVar5 = iVar5 + 1;
          *(int *)(file->file_ + lVar23 * 4) = iVar6;
          if (this->pool_->lazily_build_dependencies_ == false) {
            pOVar11 = (file->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pOVar11 != (pointer)0x0) {
              local_1a8._0_8_ = file;
              std::
              call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                        ((once_flag *)pOVar11,FileDescriptor::DependenciesOnceInit,
                         (FileDescriptor **)local_1a8);
            }
            local_1e0._0_8_ =
                 *(undefined8 *)((file->filename_).field_2._M_allocated_capacity + (long)iVar6 * 8);
            pVar35 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ::equal_range(&this_00->_M_t,(key_type *)&local_1e0);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar35.first._M_node,
                           (_Base_ptr)pVar35.second._M_node);
          }
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < (proto->public_dependency_).current_size_);
    }
    *(int *)((long)&(file->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if ((this->pool_->lazily_build_dependencies_ == false) &&
       (0 < *(int *)&(file->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_finish)) {
      lVar26 = 0;
      do {
        pOVar11 = (file->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar11 != (pointer)0x0) {
          local_1a8._0_8_ = file;
          std::
          call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                    ((once_flag *)pOVar11,FileDescriptor::DependenciesOnceInit,
                     (FileDescriptor **)local_1a8);
        }
        RecordPublicDependencies
                  (this,*(FileDescriptor **)
                         ((file->filename_).field_2._M_allocated_capacity + lVar26 * 8));
        lVar26 = lVar26 + 1;
      } while (lVar26 < *(int *)&(file->options_to_interpret_).
                                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    pFVar7 = (FileDescriptorTables *)
             DescriptorPool::Tables::AllocateBytes
                       (this->tables_,(proto->weak_dependency_).current_size_ << 2);
    file->file_tables_ = pFVar7;
    if ((proto->weak_dependency_).current_size_ < 1) {
      iVar5 = 0;
    }
    else {
      lVar26 = 0;
      iVar5 = 0;
      do {
        iVar6 = *(int *)((long)(proto->weak_dependency_).arena_or_elements_ + lVar26 * 4);
        if ((iVar6 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar6))
        {
          AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                   "Invalid weak dependency index.");
        }
        else {
          lVar23 = (long)iVar5;
          iVar5 = iVar5 + 1;
          *(int *)((long)&(file->file_tables_->symbols_by_parent_)._M_h._M_buckets + lVar23 * 4) =
               iVar6;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < (proto->weak_dependency_).current_size_);
    }
    *(int *)&(file->options_to_interpret_).
             super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar5;
    iVar5 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)((long)&(file->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar5;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar5 * 0x90);
    *(void **)&(file->dependencies_)._M_t._M_impl = pvVar10;
    if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar26 = 0;
      lVar23 = 0;
      do {
        BuildMessage(this,(DescriptorProto *)
                          ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar23]
                     ,(Descriptor *)0x0,
                     (Descriptor *)(*(long *)&(file->dependencies_)._M_t._M_impl + lVar26));
        lVar23 = lVar23 + 1;
        lVar26 = lVar26 + 0x90;
      } while (lVar23 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar5 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&file->had_errors_ = iVar5;
    pvVar10 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar5 * 0x50);
    *(void **)&(file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header = pvVar10;
    if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
      lVar26 = 0;
      lVar23 = 0;
      do {
        BuildEnum(this,(EnumDescriptorProto *)
                       ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar23],
                  (Descriptor *)0x0,
                  (EnumDescriptor *)
                  (*(long *)&(file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header +
                  lVar26));
        lVar23 = lVar23 + 1;
        lVar26 = lVar26 + 0x50;
      } while (lVar23 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar5 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&file->field_0x34 = iVar5;
    p_Var17 = (_Base_ptr)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar5 * 0x30);
    (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var17;
    if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
      lVar26 = 0;
      lVar23 = 0;
      pvVar10 = extraout_RDX;
      do {
        BuildService(this,(ServiceDescriptorProto *)
                          ((proto->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar23],
                     pvVar10,(ServiceDescriptor *)
                             ((long)&((file->dependencies_)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent)->_M_color + lVar26));
        lVar23 = lVar23 + 1;
        lVar26 = lVar26 + 0x30;
        pvVar10 = extraout_RDX_00;
      } while (lVar23 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
    }
    iVar5 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)&(file->filename_)._M_dataplus._M_p = iVar5;
    p_Var17 = (_Base_ptr)DescriptorPool::Tables::AllocateBytes(this->tables_,iVar5 * 0x98);
    (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var17;
    if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
      lVar26 = 0;
      lVar23 = 0;
      do {
        BuildFieldOrExtension
                  (this,(FieldDescriptorProto *)
                        ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar23],
                   (Descriptor *)0x0,
                   (FieldDescriptor *)
                   ((long)&((file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left)->_M_color + lVar26),true);
        lVar23 = lVar23 + 1;
        lVar26 = lVar26 + 0x98;
      } while (lVar23 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      (file->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    }
    else {
      puVar28 = (undefined1 *)proto->options_;
      if ((FileOptions *)puVar28 == (FileOptions *)0x0) {
        puVar28 = _FileOptions_default_instance_;
      }
      AllocateOptions(this,(FileOptions *)puVar28,(FileDescriptor *)file);
    }
    CrossLinkFile(this,(FileDescriptor *)file,proto);
    pFVar16 = extraout_RDX_01;
    if (this->had_errors_ == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_1a8,this);
      pOVar11 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar27 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pOVar11 != pOVar27) {
        do {
          paVar33 = &local_2b8.field_2;
          message = pOVar11->original_options;
          pMVar32 = &pOVar11->options->super_MessageLite;
          local_260 = pOVar11;
          local_1a8._8_8_ = pOVar11;
          iVar5 = (*((MessageLite *)&pMVar32->_vptr_MessageLite)->_vptr_MessageLite[0x15])(pMVar32);
          local_298._M_dataplus._M_p = (pointer)0x14;
          local_2b8._M_dataplus._M_p = (pointer)paVar33;
          local_2b8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_298);
          local_2b8.field_2._M_allocated_capacity = (size_type)local_298._M_dataplus._M_p;
          builtin_strncpy(local_2b8._M_dataplus._M_p,"uninterpreted_option",0x14);
          local_2b8._M_string_length = (size_type)local_298._M_dataplus._M_p;
          local_2b8._M_dataplus._M_p[(long)local_298._M_dataplus._M_p] = '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var,iVar5),&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar33) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_1e0,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x187d);
            pLVar19 = internal::LogMessage::operator<<
                                (&local_1e0,"CHECK failed: uninterpreted_options_field != nullptr: "
                                );
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_2b8,pLVar19);
            internal::LogMessage::~LogMessage(&local_1e0);
          }
          (*((MessageLite *)&pMVar32->_vptr_MessageLite)->_vptr_MessageLite[0x15])(pMVar32);
          Reflection::ClearField(this_03,(Message *)pMVar32,pFVar18);
          __x = &local_260->element_path;
          std::vector<int,_std::allocator<int>_>::vector(&local_278,__x);
          local_2b8._M_dataplus._M_p._0_4_ = *(int *)(pFVar18 + 0x44);
          local_230 = pMVar32;
          if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_278,
                       (iterator)
                       local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_2b8);
          }
          else {
            *local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = *(int *)(pFVar18 + 0x44);
            local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          local_298._M_dataplus._M_p = (pointer)0x14;
          local_2b8._M_dataplus._M_p = (pointer)paVar33;
          local_2b8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_2b8,(ulong)&local_298);
          local_2b8.field_2._M_allocated_capacity = (size_type)local_298._M_dataplus._M_p;
          builtin_strncpy(local_2b8._M_dataplus._M_p,"uninterpreted_option",0x14);
          local_2b8._M_string_length = (size_type)local_298._M_dataplus._M_p;
          local_2b8._M_dataplus._M_p[(long)local_298._M_dataplus._M_p] = '\0';
          pFVar18 = Descriptor::FindFieldByName
                              ((Descriptor *)CONCAT44(extraout_var_00,iVar5),&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar33) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          pMVar32 = local_230;
          if (pFVar18 == (FieldDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1888);
            pMVar32 = local_230;
            pLVar19 = internal::LogMessage::operator<<
                                (&local_68,
                                 "CHECK failed: original_uninterpreted_options_field != nullptr: ");
            pLVar19 = internal::LogMessage::operator<<
                                (pLVar19,
                                 "No field named \"uninterpreted_option\" in the Options proto.");
            internal::LogFinisher::operator=((LogFinisher *)&local_2b8,pLVar19);
            internal::LogMessage::~LogMessage(&local_68);
          }
          (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          iVar5 = Reflection::FieldSize(this_04,message,pFVar18);
          local_2b8._M_dataplus._M_p = local_2b8._M_dataplus._M_p & 0xffffffff00000000;
          if (0 < iVar5) {
            iVar6 = 0;
            do {
              if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_278,
                           (iterator)
                           local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_2b8);
              }
              else {
                *local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar6;
                local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
              auStack_198._0_8_ =
                   Reflection::GetRepeatedMessage
                             (this_05,message,pFVar18,(int)local_2b8._M_dataplus._M_p);
              bVar4 = OptionInterpreter::InterpretSingleOption
                                ((OptionInterpreter *)local_1a8,(Message *)pMVar32,&local_278,__x);
              if (!bVar4) {
                local_1a8._8_8_ = (OptionsToInterpret *)0x0;
                auStack_198._0_8_ = (DescriptorPool *)0x0;
                goto LAB_002da9a4;
              }
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
              iVar6 = (int)local_2b8._M_dataplus._M_p + 1;
              local_2b8._M_dataplus._M_p._0_4_ = iVar6;
            } while (iVar6 < iVar5);
          }
          local_1a8._8_8_ = (OptionsToInterpret *)0x0;
          auStack_198._0_8_ = (DescriptorPool *)0x0;
          iVar5 = (*pMVar32->_vptr_MessageLite[3])(pMVar32);
          this_02 = (MessageLite *)CONCAT44(extraout_var_01,iVar5);
          (*pMVar32->_vptr_MessageLite[0x15])(pMVar32);
          Reflection::Swap(this_06,(Message *)this_02,(Message *)pMVar32);
          local_2b8._M_string_length = 0;
          local_2b8.field_2._M_allocated_capacity =
               local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          bVar4 = MessageLite::AppendToString(this_02,&local_2b8);
          if ((!bVar4) || (bVar4 = MessageLite::ParseFromString(pMVar32,&local_2b8), !bVar4)) {
            local_1e8 = (DescriptorBuilder *)local_1a8._0_8_;
            Message::ShortDebugString_abi_cxx11_((string *)local_e8,(Message *)this_02);
            plVar20 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x5aecaf);
            local_208 = &local_1f8;
            plVar24 = plVar20 + 2;
            if ((long *)*plVar20 == plVar24) {
              local_1f8 = *plVar24;
              lStack_1f0 = plVar20[3];
            }
            else {
              local_1f8 = *plVar24;
              local_208 = (long *)*plVar20;
            }
            local_200 = plVar20[1];
            *plVar20 = (long)plVar24;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            plVar20 = (long *)std::__cxx11::string::append((char *)&local_208);
            local_258 = &local_248;
            puVar25 = (ulong *)(plVar20 + 2);
            if ((ulong *)*plVar20 == puVar25) {
              local_248 = *puVar25;
              lStack_240 = plVar20[3];
            }
            else {
              local_248 = *puVar25;
              local_258 = (ulong *)*plVar20;
            }
            local_250 = plVar20[1];
            *plVar20 = (long)puVar25;
            plVar20[1] = 0;
            *(undefined1 *)(plVar20 + 2) = 0;
            Message::ShortDebugString_abi_cxx11_(&local_228,(Message *)pMVar32);
            uVar29 = 0xf;
            if (local_258 != &local_248) {
              uVar29 = local_248;
            }
            if (uVar29 < local_228._M_string_length + local_250) {
              uVar30 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                uVar30 = local_228.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar30 < local_228._M_string_length + local_250) goto LAB_002da862;
              puVar21 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_228,0,(char *)0x0,(ulong)local_258);
            }
            else {
LAB_002da862:
              puVar21 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_258,(ulong)local_228._M_dataplus._M_p);
            }
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            psVar1 = puVar21 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar21 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_298.field_2._M_allocated_capacity = *psVar1;
              local_298.field_2._8_8_ = puVar21[3];
            }
            else {
              local_298.field_2._M_allocated_capacity = *psVar1;
              local_298._M_dataplus._M_p = (pointer)*puVar21;
            }
            local_298._M_string_length = puVar21[1];
            *puVar21 = psVar1;
            puVar21[1] = 0;
            *(undefined1 *)psVar1 = 0;
            AddError(local_1e8,&local_260->element_name,message,OTHER,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            if (local_258 != &local_248) {
              operator_delete(local_258);
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208);
            }
            if ((_Base_ptr)local_e8._0_8_ != (_Base_ptr)(local_e8 + 0x10)) {
              operator_delete((void *)local_e8._0_8_);
            }
            (*pMVar32->_vptr_MessageLite[0x15])(pMVar32);
            Reflection::Swap(this_07,(Message *)this_02,(Message *)pMVar32);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          (*this_02->_vptr_MessageLite[1])(this_02);
LAB_002da9a4:
          if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pOVar11 = local_260 + 1;
          pOVar27 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (pOVar11 != pOVar27);
      }
      pOVar11 = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pOVar31 = pOVar11;
      if (pOVar27 != pOVar11) {
        do {
          piVar2 = (pOVar31->element_path).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (piVar2 != (pointer)0x0) {
            operator_delete(piVar2);
          }
          pcVar3 = (pOVar31->element_name)._M_dataplus._M_p;
          if (&(pOVar31->element_name).field_2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3) {
            operator_delete(pcVar3);
          }
          pcVar3 = (pOVar31->name_scope)._M_dataplus._M_p;
          if (&(pOVar31->name_scope).field_2 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3) {
            operator_delete(pcVar3);
          }
          pOVar31 = pOVar31 + 1;
        } while (pOVar31 != pOVar27);
        (this->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_finish = pOVar11;
      }
      if (local_238 != (SourceCodeInfo *)0x0) {
        OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)local_1a8,local_238);
      }
      DynamicMessageFactory::~DynamicMessageFactory(&local_130);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_int>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~_Rb_tree(&local_160);
      std::
      _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)(auStack_198 + 8));
      pFVar16 = extraout_RDX_02;
    }
    if ((this->had_errors_ == false) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,(FileDescriptor *)file,proto);
      pFVar16 = extraout_RDX_03;
    }
    if ((this->had_errors_ == true) &&
       (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_)) {
      lVar26 = 0;
      lVar23 = 0;
      do {
        DetectMapConflicts(this,(Descriptor *)
                                (*(long *)&(file->dependencies_)._M_t._M_impl + lVar26),
                           (DescriptorProto *)
                           ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements
                           [lVar23]);
        lVar23 = lVar23 + 1;
        lVar26 = lVar26 + 0x90;
        pFVar16 = extraout_RDX_04;
      } while (lVar23 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,pFVar16);
    }
    if (this->had_errors_ != false) {
      file = (DescriptorBuilder *)0x0;
    }
LAB_002daaf7:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_98);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    file = (DescriptorBuilder *)0x0;
  }
  return (FileDescriptor *)file;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<std::string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const std::string*>(proto.dependency_size());
    if (proto.dependency_size() > 0) {
      memset(result->dependencies_names_, 0,
             sizeof(*result->dependencies_names_) * proto.dependency_size());
    }
  } else {
    result->dependencies_once_ = nullptr;
    result->dependencies_names_ = nullptr;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
          dependency =
              pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      tables_->AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      tables_->AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}